

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O2

void __thiscall
CryptoUtil_EncryptAes256CbcKeyLengthError_Test::~CryptoUtil_EncryptAes256CbcKeyLengthError_Test
          (CryptoUtil_EncryptAes256CbcKeyLengthError_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CryptoUtil, EncryptAes256CbcKeyLengthError) {
  try {
    ByteData key("0123456789abcdef");
    ByteData iv("33343536373839303132333435363738");
    ByteData byte_data = CryptoUtil::EncryptAes256Cbc(
        key.GetBytes(), iv.GetBytes(), "aiueoaiueoaiueoaiueoaiueoaiueoai");
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "EncryptAes256Cbc key size error.");
    return;
  }
  ASSERT_TRUE(false);
}